

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

bool tinyusdz::LoadMaterialXFromAsset
               (Asset *asset,string *asset_path,PrimSpec *ps,string *warn,string *err)

{
  bool bVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ostream *poVar4;
  string local_4f0 [32];
  ostringstream local_4d0 [8];
  ostringstream ss_e_1;
  string local_350 [32];
  ostringstream local_330 [8];
  ostringstream ss_e;
  undefined1 local_1b8 [8];
  MtlxModel mtlx;
  undefined1 local_58 [8];
  string str;
  string *err_local;
  string *warn_local;
  PrimSpec *ps_local;
  string *asset_path_local;
  Asset *asset_local;
  
  str.field_2._8_8_ = err;
  sVar2 = Asset::size(asset);
  if (sVar2 < 0x20) {
    if (str.field_2._8_8_ != 0) {
      ::std::__cxx11::string::operator+=
                ((string *)str.field_2._8_8_,"MateiralX: Asset size too small.\n");
    }
    asset_local._7_1_ = false;
  }
  else {
    puVar3 = Asset::data(asset);
    sVar2 = Asset::size(asset);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)local_58,(char *)puVar3,sVar2,
               (allocator *)
               ((long)&mtlx.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    ::std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&mtlx.shaders._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    MtlxModel::MtlxModel((MtlxModel *)local_1b8);
    bVar1 = ReadMaterialXFromString
                      ((string *)local_58,asset_path,(MtlxModel *)local_1b8,warn,
                       (string *)str.field_2._8_8_);
    if (bVar1) {
      bVar1 = ToPrimSpec((MtlxModel *)local_1b8,ps,(string *)str.field_2._8_8_);
      if (bVar1) {
        asset_local._7_1_ = true;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4d0);
        poVar4 = ::std::operator<<((ostream *)local_4d0,"[error]");
        poVar4 = ::std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                  );
        poVar4 = ::std::operator<<(poVar4,":");
        poVar4 = ::std::operator<<(poVar4,"LoadMaterialXFromAsset");
        poVar4 = ::std::operator<<(poVar4,"():");
        poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3f0);
        ::std::operator<<(poVar4," ");
        poVar4 = ::std::operator<<((ostream *)local_4d0,
                                   "Failed to convert MaterialX to USD PrimSpec.");
        ::std::operator<<(poVar4,"\n");
        if (str.field_2._8_8_ != 0) {
          ::std::__cxx11::ostringstream::str();
          ::std::__cxx11::string::operator+=((string *)str.field_2._8_8_,local_4f0);
          ::std::__cxx11::string::~string(local_4f0);
        }
        asset_local._7_1_ = false;
        ::std::__cxx11::ostringstream::~ostringstream(local_4d0);
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_330);
      poVar4 = ::std::operator<<((ostream *)local_330,"[error]");
      poVar4 = ::std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdMtlx.cc"
                                );
      poVar4 = ::std::operator<<(poVar4,":");
      poVar4 = ::std::operator<<(poVar4,"LoadMaterialXFromAsset");
      poVar4 = ::std::operator<<(poVar4,"():");
      poVar4 = (ostream *)::std::ostream::operator<<(poVar4,0x3ec);
      ::std::operator<<(poVar4," ");
      poVar4 = ::std::operator<<((ostream *)local_330,"Failed to read MaterialX.");
      ::std::operator<<(poVar4,"\n");
      if (str.field_2._8_8_ != 0) {
        ::std::__cxx11::ostringstream::str();
        ::std::__cxx11::string::operator+=((string *)str.field_2._8_8_,local_350);
        ::std::__cxx11::string::~string(local_350);
      }
      asset_local._7_1_ = false;
      ::std::__cxx11::ostringstream::~ostringstream(local_330);
    }
    MtlxModel::~MtlxModel((MtlxModel *)local_1b8);
    ::std::__cxx11::string::~string((string *)local_58);
  }
  return asset_local._7_1_;
}

Assistant:

bool LoadMaterialXFromAsset(const Asset &asset, const std::string &asset_path,
                            PrimSpec &ps /* inout */, std::string *warn,
                            std::string *err) {
  (void)asset_path;
  (void)warn;

  if (asset.size() < 32) {
    if (err) {
      (*err) += "MateiralX: Asset size too small.\n";
    }
    return false;
  }

  std::string str(reinterpret_cast<const char *>(asset.data()), asset.size());

  MtlxModel mtlx;
  if (!ReadMaterialXFromString(str, asset_path, &mtlx, warn, err)) {
    PUSH_ERROR_AND_RETURN("Failed to read MaterialX.");
  }

  if (!ToPrimSpec(mtlx, ps, err)) {
    PUSH_ERROR_AND_RETURN("Failed to convert MaterialX to USD PrimSpec.");
  }

  return true;
}